

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

void dumpStringOffsetsSection
               (raw_ostream *OS,StringRef SectionName,DWARFObject *Obj,
               DWARFSection *StringOffsetsSection,StringRef StringSection,unit_iterator_range Units,
               bool LittleEndian,uint MaxVersion)

{
  char cVar1;
  ushort uVar2;
  undefined4 uVar3;
  DWARFUnit *pDVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined7 uVar9;
  uint32_t uVar10;
  ulong uVar11;
  pointer pOVar12;
  raw_ostream *prVar13;
  pointer pOVar14;
  byte bVar15;
  size_t sVar16;
  long lVar17;
  pointer pOVar18;
  char *pcVar19;
  undefined7 in_register_00000089;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar20;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  char *pcVar21;
  _func_int **pp_Var22;
  long lVar23;
  undefined1 auVar24 [8];
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  char *local_f0;
  uint64_t StringOffset;
  undefined1 local_e0 [8];
  DWARFDataExtractor StrOffsetExt;
  undefined1 local_a8 [8];
  DataExtractor StrData;
  undefined **local_70;
  uint64_t offset;
  char *local_60;
  undefined1 auStack_58 [8];
  ContributionCollection Contributions;
  char *local_38;
  uint64_t Offset;
  
  puVar20 = (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
            CONCAT71(in_register_00000089,LittleEndian);
  Str_00.Length = SectionName.Length;
  StrOffsetExt.Section = (DWARFSection *)SectionName.Data;
  if (MaxVersion < 5) {
    local_e0 = (undefined1  [8])(StringOffsetsSection->Data).Data;
    pp_Var22 = (_func_int **)(StringOffsetsSection->Data).Length;
    StrOffsetExt.super_DataExtractor.Data.Length._0_1_ = (byte)Units.end_iterator;
    StrOffsetExt.super_DataExtractor.Data.Length._1_1_ = 0;
    local_70 = (_func_int **)0x0;
    StrOffsetExt.super_DataExtractor.Data.Data = (char *)pp_Var22;
    if (((ulong)pp_Var22 & 3) != 0) {
      Str.Length = 0x10;
      Str.Data = "error: size of .";
      prVar13 = llvm::raw_ostream::operator<<(OS,Str);
      Str_00.Data = (char *)StrOffsetExt.Section;
      prVar13 = llvm::raw_ostream::operator<<(prVar13,Str_00);
      Str_01.Length = 0x16;
      Str_01.Data = " is not a multiple of ";
      prVar13 = llvm::raw_ostream::operator<<(prVar13,Str_01);
      prVar13 = llvm::raw_ostream::operator<<(prVar13,4);
      Str_02.Length = 2;
      Str_02.Data = ".\n";
      llvm::raw_ostream::operator<<(prVar13,Str_02);
      pp_Var22 = (_func_int **)((ulong)pp_Var22 & 0xfffffffffffffffc);
    }
    auStack_58 = (undefined1  [8])StringSection.Data;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)StringSection.Length;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = CONCAT11(0,(byte)Units.end_iterator);
    if (pp_Var22 != (_func_int **)0x0) {
      StrData.Data.Length = (size_t)(_func_int **)0x0;
      do {
        StrData.Data.Data = "0x%8.8lx: ";
        local_a8 = (undefined1  [8])&PTR_home_00d77818;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)local_a8);
        uVar10 = llvm::DataExtractor::getU32
                           ((DataExtractor *)local_e0,(uint64_t *)&stack0xffffffffffffff90,
                            (Error *)0x0);
        StrData.Data.Length = (size_t)uVar10;
        StrData.Data.Data = "%8.8lx  ";
        local_a8 = (undefined1  [8])&PTR_home_00d77818;
        local_38 = (char *)StrData.Data.Length;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)local_a8);
        pcVar21 = llvm::DataExtractor::getCStr((DataExtractor *)auStack_58,(uint64_t *)&local_38);
        if (pcVar21 != (char *)0x0) {
          StrData.Data.Data = "\"%s\"";
          local_a8 = (undefined1  [8])&PTR_home_00d77b48;
          StrData.Data.Length = (size_t)pcVar21;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)local_a8);
        }
        Str_03.Length = 1;
        Str_03.Data = "\n";
        llvm::raw_ostream::operator<<(OS,Str_03);
        StrData.Data.Length = (size_t)local_70;
      } while (local_70 < pp_Var22);
    }
  }
  else {
    auStack_58 = (undefined1  [8])0x0;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    StrData._16_8_ = StringOffsetsSection;
    if (puVar20 != Units.begin_iterator) {
      do {
        pDVar4 = (puVar20->_M_t).
                 super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
                 super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
        if (*(bool *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 0x18) == true) {
          if (Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>
            ::_M_realloc_insert<llvm::Optional<llvm::StrOffsetsContributionDescriptor>const&>
                      ((vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>
                        *)auStack_58,
                       (iterator)
                       Contributions.
                       super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       &pDVar4->StringOffsetsTableContribution);
          }
          else {
            uVar5 = (pDVar4->StringOffsetsTableContribution).Storage.field_0.value.Base;
            uVar6 = *(uint64_t *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 8);
            uVar7 = *(undefined8 *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 0x18);
            *(undefined8 *)
             ((long)&((Contributions.
                       super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->Storage).field_0 + 0x10) =
                 *(undefined8 *)((long)&(pDVar4->StringOffsetsTableContribution).Storage + 0x10);
            *(undefined8 *)
             &((Contributions.
                super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->Storage).hasVal = uVar7;
            ((Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->Storage).field_0.value.Base = uVar5;
            ((Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->Storage).field_0.value.Size = uVar6;
            Contributions.
            super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 Contributions.
                 super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        pOVar12 = Contributions.
                  super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar24 = auStack_58;
        puVar20 = puVar20 + 1;
      } while (puVar20 != Units.begin_iterator);
      if (auStack_58 !=
          (undefined1  [8])
          Contributions.
          super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar23 = (long)Contributions.
                       super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58;
        uVar11 = lVar23 >> 5;
        lVar17 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                  (auStack_58,
                   Contributions.
                   super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar23 < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                    (auVar24,pOVar12);
        }
        else {
          pOVar18 = (pointer)((long)auVar24 + 0x200);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                    (auVar24,pOVar18);
          for (; pOVar18 != pOVar12; pOVar18 = pOVar18 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Val_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                      (pOVar18);
          }
        }
      }
    }
    pOVar12 = (pointer)((long)auStack_58 + 0x20);
    if (pOVar12 !=
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start &&
        auStack_58 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        if ((((pOVar12[-1].Storage.hasVal == true) && ((pOVar12->Storage).hasVal == true)) &&
            (pOVar12[-1].Storage.field_0.value.Base == (pOVar12->Storage).field_0.value.Base)) &&
           (pOVar12[-1].Storage.field_0.value.Size == (pOVar12->Storage).field_0.value.Size)) {
          pOVar18 = pOVar12 + -1;
          if (pOVar18 !=
              Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            while (pOVar14 = pOVar12, pOVar12 = pOVar14 + 1,
                  pOVar12 !=
                  Contributions.
                  super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
              if ((((pOVar18->Storage).hasVal != true) || (pOVar14[1].Storage.hasVal != true)) ||
                 (((pOVar18->Storage).field_0.value.Base != (pOVar12->Storage).field_0.value.Base ||
                  ((pOVar18->Storage).field_0.value.Size != pOVar14[1].Storage.field_0.value.Size)))
                 ) {
                uVar5 = (pOVar12->Storage).field_0.value.Base;
                uVar6 = pOVar14[1].Storage.field_0.value.Size;
                bVar8 = pOVar14[1].Storage.hasVal;
                uVar9 = *(undefined7 *)&pOVar14[1].Storage.field_0x19;
                *(undefined8 *)((long)&pOVar18[1].Storage.field_0 + 0x10) =
                     *(undefined8 *)((long)&pOVar14[1].Storage.field_0 + 0x10);
                pOVar18[1].Storage.hasVal = bVar8;
                *(undefined7 *)&pOVar18[1].Storage.field_0x19 = uVar9;
                pOVar18[1].Storage.field_0.value.Base = uVar5;
                pOVar18[1].Storage.field_0.value.Size = uVar6;
                pOVar18 = pOVar18 + 1;
              }
            }
            if (pOVar18 + 1 !=
                Contributions.
                super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start = pOVar18 + 1;
            }
          }
          break;
        }
        pOVar12 = pOVar12 + 1;
      } while (pOVar12 !=
               Contributions.
               super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    pOVar12 = Contributions.
              super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_e0 = *(undefined1 (*) [8])StrData._16_8_;
    StringOffset = *(uint64_t *)(StrData._16_8_ + 8);
    StrOffsetExt.super_DataExtractor.Data.Length._0_1_ = (byte)Units.end_iterator;
    StrOffsetExt.super_DataExtractor.Data.Length._1_1_ = 0;
    StrOffsetExt.Obj = (DWARFObject *)StrData._16_8_;
    StrData.Data.Length._0_2_ = CONCAT11(0,(byte)Units.end_iterator);
    local_38 = (char *)0x0;
    StrOffsetExt.super_DataExtractor.Data.Data = (char *)StringOffset;
    StrOffsetExt.super_DataExtractor._16_8_ = Obj;
    local_a8 = (undefined1  [8])StringSection.Data;
    StrData.Data.Data = (char *)StringSection.Length;
    if (auStack_58 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      StrData._16_8_ = &PTR_home_00d77b48;
      auVar24 = auStack_58;
      do {
        if ((((pointer)auVar24)->Storage).hasVal == false) {
          sVar16 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
          if (sVar16 < 0x40) {
            OS = (raw_ostream *)llvm::raw_ostream::write(OS,0xbc7065,(void *)0x40,sVar16);
          }
          else {
            builtin_strncpy(OS->OutBufCur,
                            "error: invalid contribution to string offsets table in section .",0x40)
            ;
            OS->OutBufCur = OS->OutBufCur + 0x40;
          }
          Str_04.Length = Str_00.Length;
          Str_04.Data = (char *)StrOffsetExt.Section;
          prVar13 = llvm::raw_ostream::operator<<(OS,Str_04);
          pcVar21 = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar21) < 2) {
            llvm::raw_ostream::write(prVar13,0xbcf692,(void *)0x2,(size_t)pcVar21);
            goto LAB_00ae0773;
          }
LAB_00ae0762:
          pcVar21[0] = '.';
          pcVar21[1] = '\n';
          lVar17 = 2;
          goto LAB_00ae0770;
        }
        cVar1 = *(char *)((long)&(((pointer)auVar24)->Storage).field_0 + 0x13);
        uVar2 = (((pointer)auVar24)->Storage).field_0.value.FormParams.Version;
        uVar11 = (ulong)(cVar1 == '\0') << 3 | 0xfffffffffffffff0;
        bVar15 = (byte)uVar2;
        if (bVar15 < 5) {
          uVar11 = 0;
        }
        pcVar21 = (char *)(uVar11 + (((pointer)auVar24)->Storage).field_0.value.Base);
        if (pcVar21 < local_38) {
          prVar13 = llvm::WithColor::error();
          pcVar21 = prVar13->OutBufCur;
          if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar21) < 0x3e) {
            prVar13 = (raw_ostream *)
                      llvm::raw_ostream::write(prVar13,0xbc70a6,(void *)0x3e,(size_t)pcVar21);
          }
          else {
            builtin_strncpy(pcVar21,"overlapping contributions to string offsets table in section ."
                            ,0x3e);
            prVar13->OutBufCur = prVar13->OutBufCur + 0x3e;
          }
          Str_05.Length = Str_00.Length;
          Str_05.Data = (char *)StrOffsetExt.Section;
          prVar13 = llvm::raw_ostream::operator<<(prVar13,Str_05);
          pcVar21 = prVar13->OutBufCur;
          if (1 < (ulong)((long)prVar13->OutBufEnd - (long)pcVar21)) goto LAB_00ae0762;
          llvm::raw_ostream::write(prVar13,0xbcf692,(void *)0x2,(size_t)pcVar21);
          goto LAB_00ae0773;
        }
        if (local_38 < pcVar21) {
          offset = (uint64_t)anon_var_dwarf_31d57b0;
          local_70 = &PTR_home_00d77818;
          local_60 = local_38;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
          prVar13 = llvm::raw_ostream::operator<<(OS,(long)pcVar21 - (long)local_38);
          pcVar19 = prVar13->OutBufCur;
          if (prVar13->OutBufEnd == pcVar19) {
            llvm::raw_ostream::write(prVar13,0xba6bdf,&DAT_00000001,(size_t)pcVar19);
          }
          else {
            *pcVar19 = '\n';
            prVar13->OutBufCur = prVar13->OutBufCur + 1;
          }
        }
        offset = (long)"\n0x%8.8lx: " + 1;
        local_70 = &PTR_home_00d77818;
        local_60 = pcVar21;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
        sVar16 = (long)OS->OutBufEnd - (long)OS->OutBufCur;
        if (sVar16 < 0x14) {
          prVar13 = (raw_ostream *)llvm::raw_ostream::write(OS,0xbc70fe,(void *)0x14,sVar16);
        }
        else {
          builtin_strncpy(OS->OutBufCur,"Contribution size = ",0x14);
          OS->OutBufCur = OS->OutBufCur + 0x14;
          prVar13 = OS;
        }
        if ((((pointer)auVar24)->Storage).hasVal == false) {
LAB_00ae0804:
          __assert_fail("hasVal",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                        ,0xad,
                        "T &llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor>::getValue() & [T = llvm::StrOffsetsContributionDescriptor]"
                       );
        }
        prVar13 = llvm::raw_ostream::operator<<
                            (prVar13,(ulong)(4 < bVar15) * 4 +
                                     (((pointer)auVar24)->Storage).field_0.value.Size);
        pcVar21 = prVar13->OutBufCur;
        if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar21) < 0xb) {
          prVar13 = (raw_ostream *)
                    llvm::raw_ostream::write(prVar13,0xbc7113,(void *)0xb,(size_t)pcVar21);
          pcVar21 = prVar13->OutBufCur;
        }
        else {
          builtin_strncpy(pcVar21,", Format = ",0xb);
          pcVar21 = prVar13->OutBufCur + 0xb;
          prVar13->OutBufCur = pcVar21;
        }
        pcVar19 = "DWARF64";
        if (cVar1 == '\0') {
          pcVar19 = "DWARF32";
        }
        if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar21) < 7) {
          prVar13 = (raw_ostream *)
                    llvm::raw_ostream::write(prVar13,(int)pcVar19,(void *)0x7,(size_t)pcVar21);
          pcVar21 = prVar13->OutBufCur;
        }
        else {
          uVar3 = *(undefined4 *)pcVar19;
          *(undefined4 *)(pcVar21 + 3) = *(undefined4 *)(pcVar19 + 3);
          *(undefined4 *)pcVar21 = uVar3;
          pcVar21 = prVar13->OutBufCur + 7;
          prVar13->OutBufCur = pcVar21;
        }
        if ((ulong)((long)prVar13->OutBufEnd - (long)pcVar21) < 0xc) {
          prVar13 = (raw_ostream *)
                    llvm::raw_ostream::write(prVar13,0xbc7127,(void *)0xc,(size_t)pcVar21);
        }
        else {
          builtin_strncpy(pcVar21,", Version = ",0xc);
          prVar13->OutBufCur = prVar13->OutBufCur + 0xc;
        }
        prVar13 = llvm::raw_ostream::operator<<(prVar13,(ulong)uVar2 & 0xff);
        pcVar21 = prVar13->OutBufCur;
        if (prVar13->OutBufEnd == pcVar21) {
          llvm::raw_ostream::write(prVar13,0xba6bdf,&DAT_00000001,(size_t)pcVar21);
        }
        else {
          *pcVar21 = '\n';
          prVar13->OutBufCur = prVar13->OutBufCur + 1;
        }
        if ((((pointer)auVar24)->Storage).hasVal == false) goto LAB_00ae0804;
        local_38 = (char *)(((pointer)auVar24)->Storage).field_0.value.Base;
        cVar1 = *(char *)((long)&(((pointer)auVar24)->Storage).field_0 + 0x13);
        uVar10 = 4;
        if (cVar1 != '\0') {
          if (cVar1 != '\x01') {
            llvm::llvm_unreachable_internal
                      ("Invalid Format value",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/BinaryFormat/Dwarf.h"
                       ,0x230);
          }
          uVar10 = 8;
        }
        while ((long)local_38 - (((pointer)auVar24)->Storage).field_0.value.Base <
               (((pointer)auVar24)->Storage).field_0.value.Size) {
          offset = (long)"\n0x%8.8lx: " + 1;
          local_70 = &PTR_home_00d77818;
          local_60 = local_38;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
          local_f0 = (char *)llvm::DWARFDataExtractor::getRelocatedValue
                                       ((DWARFDataExtractor *)local_e0,uVar10,(uint64_t *)&local_38,
                                        (uint64_t *)0x0,(Error *)0x0);
          pcVar21 = "%8.8lx ";
          offset = (long)"0x%8.8lx " + 2;
          local_70 = &PTR_home_00d77818;
          local_60 = local_f0;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
          pcVar19 = llvm::DataExtractor::getCStr((DataExtractor *)local_a8,(uint64_t *)&local_f0);
          if (pcVar19 != (char *)0x0) {
            offset = (uint64_t)anon_var_dwarf_31d577a;
            local_70 = (undefined **)StrData._16_8_;
            pcVar21 = (char *)StrData._16_8_;
            local_60 = pcVar19;
            llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
          }
          if (OS->OutBufEnd == OS->OutBufCur) {
            llvm::raw_ostream::write(OS,0xba6bdf,&DAT_00000001,(size_t)pcVar21);
          }
          else {
            *OS->OutBufCur = '\n';
            OS->OutBufCur = OS->OutBufCur + 1;
          }
          if ((((pointer)auVar24)->Storage).hasVal == false) goto LAB_00ae0804;
        }
        auVar24 = (undefined1  [8])((long)auVar24 + 0x20);
      } while (auVar24 != (undefined1  [8])pOVar12);
    }
    uVar5 = StringOffset;
    if (local_38 < StringOffset) {
      offset = (uint64_t)anon_var_dwarf_31d57b0;
      local_70 = &PTR_home_00d77818;
      local_60 = local_38;
      llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffff90);
      prVar13 = llvm::raw_ostream::operator<<(OS,uVar5 - (long)local_38);
      pcVar21 = prVar13->OutBufCur;
      if (prVar13->OutBufEnd == pcVar21) {
        llvm::raw_ostream::write(prVar13,0xba6bdf,&DAT_00000001,(size_t)pcVar21);
      }
      else {
        *pcVar21 = '\n';
        lVar17 = 1;
LAB_00ae0770:
        prVar13->OutBufCur = prVar13->OutBufCur + lVar17;
      }
    }
LAB_00ae0773:
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)Contributions.
                            super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
  }
  return;
}

Assistant:

static void dumpStringOffsetsSection(raw_ostream &OS, StringRef SectionName,
                                     const DWARFObject &Obj,
                                     const DWARFSection &StringOffsetsSection,
                                     StringRef StringSection,
                                     DWARFContext::unit_iterator_range Units,
                                     bool LittleEndian, unsigned MaxVersion) {
  // If we have at least one (compile or type) unit with DWARF v5 or greater,
  // we assume that the section is formatted like a DWARF v5 string offsets
  // section.
  if (MaxVersion >= 5)
    dumpDWARFv5StringOffsetsSection(OS, SectionName, Obj, StringOffsetsSection,
                                    StringSection, Units, LittleEndian);
  else {
    DataExtractor strOffsetExt(StringOffsetsSection.Data, LittleEndian, 0);
    uint64_t offset = 0;
    uint64_t size = StringOffsetsSection.Data.size();
    // Ensure that size is a multiple of the size of an entry.
    if (size & ((uint64_t)(sizeof(uint32_t) - 1))) {
      OS << "error: size of ." << SectionName << " is not a multiple of "
         << sizeof(uint32_t) << ".\n";
      size &= -(uint64_t)sizeof(uint32_t);
    }
    DataExtractor StrData(StringSection, LittleEndian, 0);
    while (offset < size) {
      OS << format("0x%8.8" PRIx64 ": ", offset);
      uint64_t StringOffset = strOffsetExt.getU32(&offset);
      OS << format("%8.8" PRIx64 "  ", StringOffset);
      const char *S = StrData.getCStr(&StringOffset);
      if (S)
        OS << format("\"%s\"", S);
      OS << "\n";
    }
  }
}